

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

void mserialize::CustomDeserializer<Person,_void>::deserialize(Person *p,InputStream *istream)

{
  bool bVar1;
  runtime_error *this;
  size_t in_RCX;
  InputStream *in_RSI;
  string foobar;
  char buffer [6];
  InputStream *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  allocator local_39;
  string local_38 [32];
  char local_18 [24];
  
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  InputStream::read(in_RSI,(int)local_18,(void *)0x6,in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_18,6,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = std::operator!=(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (!bVar1) {
    deserialize<int,InputStream>((int *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    deserialize<std::__cxx11::string,InputStream>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_38);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::runtime_error::runtime_error(this,local_70);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void deserialize(Person& p, InputStream& istream)
  {
    char buffer[6] = {0};
    istream.read(buffer, 6);
    const std::string foobar(buffer, 6);
    if (foobar != "foobar")
    {
      throw std::runtime_error("Invalid magic: " + foobar);
    }

    mserialize::deserialize(p.age, istream);
    mserialize::deserialize(p.name, istream);
  }